

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::Clone
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          Recycler *recycler)

{
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])
             &SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ee0091;
  data.filename._0_4_ = 0x15d;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  this_00 = (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *)
            new<Memory::Recycler>(0x30,alloc,0x387914);
  SimpleDictionaryTypeHandlerBase(this_00,recycler,this);
  return &this_00->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, SimpleDictionaryTypeHandlerBase, recycler, this);
    }